

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O1

void __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::parse(parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        *this,bool strict,
       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
       *result)

{
  value_t __tmp;
  token_type tVar1;
  value_t t;
  undefined7 in_register_00000031;
  json_value *this_00;
  json_value local_38;
  value_t local_30;
  json_value local_28;
  
  tVar1 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::scan(&this->m_lexer);
  this->last_token = tVar1;
  parse_internal(this,true,result);
  if ((int)CONCAT71(in_register_00000031,strict) != 0) {
    tVar1 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::scan(&this->m_lexer);
    this->last_token = tVar1;
    if (tVar1 != end_of_input) {
      parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
      ::parse(this);
    }
  }
  if (this->errored == true) {
    this_00 = &local_28;
    t = result->m_type;
    result->m_type = discarded;
    local_28 = result->m_value;
    (result->m_value).object = (object_t *)0x0;
    local_30 = t;
  }
  else {
    if (result->m_type != discarded) {
      return;
    }
    this_00 = &local_38;
    result->m_type = null;
    local_38 = result->m_value;
    (result->m_value).object = (object_t *)0x0;
    t = discarded;
  }
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&this_00->boolean,t);
  return;
}

Assistant:

void parse(const bool strict, BasicJsonType& result)
{
// read first token
get_token();

parse_internal(true, result);
result.assert_invariant();

// in strict mode, input must be completely read
if (strict)
{
get_token();
expect(token_type::end_of_input);
}

// in case of an error, return discarded value
if (errored)
{
result = value_t::discarded;
return;
}

// set top-level value to null if it was discarded by the callback
// function
if (result.is_discarded())
{
result = nullptr;
}
}